

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O2

void QGuiApplicationPrivate::processWindowStateChangedEvent(WindowStateChangedEvent *wse)

{
  WindowStates state;
  Data *pDVar1;
  QWindow *window;
  WindowState WVar2;
  WindowState _t1;
  QWindowPrivate *this;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (wse->window).wp.d;
  if (((pDVar1 != (Data *)0x0) && ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i != 0))
     && (window = (QWindow *)(wse->window).wp.value, window != (QWindow *)0x0)) {
    this = qt_window_private(window);
    WVar2 = QWindowPrivate::effectiveState
                      ((WindowStates)
                       (this->windowState).super_QFlagsStorageHelper<Qt::WindowState,_4>.
                       super_QFlagsStorage<Qt::WindowState>.i);
    state.super_QFlagsStorageHelper<Qt::WindowState,_4>.super_QFlagsStorage<Qt::WindowState>.i =
         (QFlagsStorageHelper<Qt::WindowState,_4>)
         (wse->newState).super_QFlagsStorageHelper<Qt::WindowState,_4>.
         super_QFlagsStorage<Qt::WindowState>.i;
    (this->windowState).super_QFlagsStorageHelper<Qt::WindowState,_4>.
    super_QFlagsStorage<Qt::WindowState>.i =
         (Int)state.super_QFlagsStorageHelper<Qt::WindowState,_4>.
              super_QFlagsStorage<Qt::WindowState>.i;
    _t1 = QWindowPrivate::effectiveState(state);
    if (_t1 != WVar2) {
      QWindow::windowStateChanged(window,_t1);
    }
    QWindowPrivate::updateVisibility(this);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QWindowStateChangeEvent::QWindowStateChangeEvent
              ((QWindowStateChangeEvent *)local_48,
               (WindowStates)
               (wse->oldState).super_QFlagsStorageHelper<Qt::WindowState,_4>.
               super_QFlagsStorage<Qt::WindowState>.i,false);
    QCoreApplication::sendSpontaneousEvent((QObject *)window,(QEvent *)local_48);
    QWindowStateChangeEvent::~QWindowStateChangeEvent((QWindowStateChangeEvent *)local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGuiApplicationPrivate::processWindowStateChangedEvent(QWindowSystemInterfacePrivate::WindowStateChangedEvent *wse)
{
    if (QWindow *window = wse->window.data()) {
        QWindowPrivate *windowPrivate = qt_window_private(window);
        const auto originalEffectiveState = QWindowPrivate::effectiveState(windowPrivate->windowState);

        windowPrivate->windowState = wse->newState;
        const auto newEffectiveState = QWindowPrivate::effectiveState(windowPrivate->windowState);
        if (newEffectiveState != originalEffectiveState)
            emit window->windowStateChanged(newEffectiveState);

        windowPrivate->updateVisibility();

        QWindowStateChangeEvent e(wse->oldState);
        QGuiApplication::sendSpontaneousEvent(window, &e);
    }
}